

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

ly_bool lyd_meta_is_internal(lyd_meta *meta)

{
  lysc_ext_instance *plVar1;
  int iVar2;
  
  plVar1 = meta->annotation;
  if (plVar1 == (lysc_ext_instance *)0x0) {
    __assert_fail("meta->annotation",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x47f,"ly_bool lyd_meta_is_internal(const struct lyd_meta *)");
  }
  iVar2 = strcmp(plVar1->module->name,"yang");
  if ((iVar2 == 0) && (iVar2 = strcmp(plVar1->argument,"lyds_tree"), iVar2 == 0)) {
    return '\x01';
  }
  return '\0';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_meta_is_internal(const struct lyd_meta *meta)
{
    const char *arg;

    assert(meta->annotation);

    arg = meta->annotation->argument;
    if (!strcmp(meta->annotation->module->name, "yang") && !strcmp(arg, "lyds_tree")) {
        return 1;
    }

    return 0;
}